

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O1

bool ON_GetGrevilleKnotVector
               (int g_stride,double *g,bool bPeriodic,int order,int cv_count,double *knot)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  undefined8 uVar10;
  double *pdVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  double *pdVar15;
  bool bVar16;
  int iVar17;
  long lVar18;
  double dVar19;
  double *pdVar20;
  double dVar21;
  double adStack_80 [2];
  double *local_70;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  double *local_50;
  double *local_48;
  double local_40;
  int local_34;
  
  local_58 = CONCAT44(in_register_0000000c,order);
  pdVar8 = adStack_80 + 1;
  bVar16 = false;
  bVar3 = false;
  if (order < cv_count && order != 2 || !bPeriodic) {
    dVar19 = (double)(ulong)(uint)cv_count;
    bVar3 = bVar16;
    if ((((order <= cv_count) && (1 < order)) && (0 < g_stride)) &&
       ((g != (double *)0x0 && (knot != (double *)0x0)))) {
      uVar4 = order - 1;
      local_40 = (double)(ulong)uVar4;
      if (uVar4 == 1) {
        bVar3 = true;
        if (0 < cv_count) {
          uVar6 = 0;
          do {
            knot[uVar6] = *g;
            uVar6 = uVar6 + 1;
            g = g + (uint)g_stride;
          } while (dVar19 != (double)uVar6);
        }
      }
      else {
        pdVar20 = (double *)(1.0 / (double)(int)uVar4);
        iVar17 = order + cv_count + -2;
        uVar13 = (cv_count - order) + 2;
        if (bPeriodic) {
          lVar18 = (long)(int)(uVar13 + uVar4 * 2);
          adStack_80[0] = 2.46626947992565e-317;
          local_50 = pdVar20;
          local_34 = iVar17;
          pdVar20 = (double *)onmalloc(lVar18 * 8);
          iVar17 = (int)local_58;
          if (1 < iVar17) {
            uVar6 = 0;
            do {
              pdVar20[uVar6] =
                   (*g - g[(long)(int)uVar13 + -1]) + g[(long)(int)(uVar13 - iVar17) + uVar6];
              uVar6 = uVar6 + 1;
            } while (((ulong)local_40 & 0xffffffff) != uVar6);
          }
          uVar4 = SUB84(local_40,0);
          uVar2 = uVar4 * 2;
          local_60 = (ulong)uVar2;
          if (0 < (int)uVar13) {
            uVar6 = 0;
            do {
              pdVar20[((ulong)local_40 & 0xffffffff) + uVar6] = g[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar13 != uVar6);
          }
          if (iVar17 <= (int)uVar2) {
            lVar9 = 0;
            do {
              pdVar20[(int)(uVar13 + uVar4) + lVar9] =
                   (g[(long)(int)uVar13 + -1] - *g) + g[lVar9 + 1];
              lVar7 = (int)(uVar13 + uVar4) + lVar9;
              lVar9 = lVar9 + 1;
            } while (lVar7 + 1 < lVar18);
          }
          uVar14 = uVar13 + iVar17;
          if (uVar14 != 0 && SCARRY4(uVar13,iVar17) == (int)uVar14 < 0) {
            uVar13 = (uint)((ulong)local_40 >> 1) & 0x7fffffff & -(uVar4 & 1);
            uVar6 = 0;
            pdVar8 = pdVar20;
            do {
              dVar1 = pdVar20[uVar6];
              dVar21 = dVar1;
              if (2 < iVar17) {
                uVar12 = 1;
                do {
                  dVar21 = dVar21 + pdVar8[uVar12];
                  uVar12 = uVar12 + 1;
                } while (((ulong)local_40 & 0xffffffff) != uVar12);
              }
              dVar21 = dVar21 * (double)local_50;
              if ((uVar13 != 0) &&
                 (ABS(dVar21 - pdVar20[uVar13 + uVar6]) <=
                  (pdVar20[(long)(int)uVar4 + (uVar6 - 1)] - dVar1) * 1.490116119385e-08)) {
                dVar21 = pdVar20[uVar13 + uVar6];
              }
              pdVar20[uVar6] = dVar21;
              uVar6 = uVar6 + 1;
              pdVar8 = pdVar8 + 1;
            } while (uVar6 != uVar14);
          }
          lVar18 = -((ulong)(uint)(iVar17 * iVar17) * 8 + 0xf & 0x3fffffff0);
          pdVar8 = (double *)((long)adStack_80 + lVar18 + 8U);
          lVar9 = 0;
          local_70 = knot;
          local_50 = pdVar8;
          local_48 = pdVar20;
          if (uVar4 != 0) {
            local_68 = 0;
            uVar6 = (ulong)(int)uVar4;
            local_40 = 0.0;
            uVar12 = 0;
            uVar10 = local_58;
            pdVar15 = pdVar20;
            adStack_80[1] = dVar19;
            local_60 = uVar6;
            do {
              pdVar11 = local_50;
              cv_count = SUB84(dVar19,0);
              dVar1 = *g;
              if (dVar1 < pdVar15[uVar6] || dVar1 == pdVar15[uVar6]) {
                if (dVar1 < pdVar15[uVar6 - 1]) break;
                *(undefined8 *)((long)adStack_80 + lVar18) = 0x4c2d23;
                ON_EvaluateNurbsBasis((int)uVar10,pdVar15,dVar1,pdVar11);
                dVar1 = *pdVar11;
                pdVar20 = local_48;
                uVar6 = local_60;
                uVar10 = local_58;
                dVar19 = adStack_80[1];
                if (local_40 < dVar1) {
                  local_68 = uVar12 & 0xffffffff;
                  local_40 = dVar1;
                }
              }
              cv_count = SUB84(dVar19,0);
              uVar12 = uVar12 + 1;
              pdVar15 = pdVar15 + 1;
            } while (uVar2 + (uVar2 == 0) != uVar12);
            lVar9 = (long)(int)local_68;
          }
          pdVar15 = local_70;
          lVar7 = (long)local_34;
          *(undefined8 *)((long)adStack_80 + lVar18) = 0x4c2d75;
          memcpy(pdVar15,pdVar20 + lVar9,lVar7 << 3);
          uVar10 = local_58;
          *(undefined8 *)((long)adStack_80 + lVar18) = 0x4c2d84;
          bVar3 = ON_MakeKnotVectorPeriodic((int)uVar10,cv_count,pdVar15);
        }
        else {
          if (g < knot + iVar17 && knot < g) {
            adStack_80[0] = 2.46660149203965e-317;
            local_50 = pdVar20;
            local_34 = iVar17;
            local_48 = (double *)onmalloc((ulong)(uint)cv_count * 8);
            if (0 < cv_count) {
              uVar6 = 0;
              do {
                local_48[uVar6] = *g;
                uVar6 = uVar6 + 1;
                g = g + (uint)g_stride;
              } while ((uint)cv_count != uVar6);
            }
            g_stride = 1;
            g = local_48;
            pdVar20 = local_50;
            iVar17 = local_34;
          }
          else {
            local_48 = (double *)0x0;
          }
          iVar5 = (int)local_58;
          if (1 < iVar5) {
            uVar6 = 0;
            do {
              knot[uVar6] = *g;
              uVar6 = uVar6 + 1;
            } while (((ulong)local_40 & 0xffffffff) != uVar6);
          }
          bVar3 = true;
          if (iVar5 <= cv_count) {
            bVar3 = true;
            lVar18 = (long)SUB84(local_40,0);
            pdVar15 = g;
            do {
              pdVar15 = pdVar15 + g_stride;
              dVar19 = 0.0;
              uVar6 = (ulong)local_40 & 0xffffffff;
              pdVar11 = pdVar15;
              if (1 < iVar5) {
                do {
                  dVar19 = dVar19 + *pdVar11;
                  uVar6 = uVar6 - 1;
                  pdVar11 = pdVar11 + g_stride;
                } while (uVar6 != 0);
              }
              dVar19 = dVar19 * (double)pdVar20;
              knot[lVar18] = dVar19;
              if ((dVar19 < knot[lVar18 + -1]) || (dVar19 <= knot[lVar18 - SUB84(local_40,0)])) {
                bVar3 = false;
              }
              lVar18 = lVar18 + 1;
            } while ((int)lVar18 != cv_count);
          }
          if (cv_count <= iVar17) {
            uVar6 = (ulong)(cv_count - 1U);
            pdVar20 = knot + uVar6;
            do {
              *pdVar20 = g[(int)(g_stride * (cv_count - 1U))];
              pdVar20 = pdVar20 + 1;
              uVar4 = (int)uVar6 + 1;
              uVar6 = (ulong)uVar4;
              pdVar8 = adStack_80 + 1;
            } while ((int)uVar4 < iVar17);
          }
        }
        pdVar20 = local_48;
        if (local_48 != (double *)0x0) {
          pdVar8[-1] = 2.46674674733953e-317;
          onfree(pdVar20);
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool ON_GetGrevilleKnotVector( // get knots from Greville abcissa
          int g_stride,     
          const double *g,  // if not periodic, g[cv_count], 
                            // if periodic, g[cv_count-order+2]
                            // usually, g[0] = 0, g[i] = |P[i]-P[i-1]|^q
          bool bPeriodic,
          int order, 
          int cv_count, 
          double* knot
          )
{
  bool rc = false;
  double* p = nullptr;
  int ki, knot_count, g_count, gi, j, degree;
  double k, dd;

  if ( g_stride < 1 || !g || !knot || order < 2 || cv_count < order )
    return false;
  if ( bPeriodic && order == 2 )
    return false;
  if ( bPeriodic && cv_count - order + 2 < 3 )
    return false;

  degree = order-1;
  if ( degree == 1 ) {
    for ( j = 0; j < cv_count; j++ ) {
      knot[j] = g[j*g_stride];
    }
    return true;
  }
  dd = 1.0/degree;
  knot_count = ON_KnotCount( order, cv_count );
  g_count = (bPeriodic) ? cv_count-order+2 : cv_count;

  if ( bPeriodic ) {
    int half_degree = (degree%2) ? degree/2 : 0;
    // step 1: set p[] = fully periodic list of abcissa
    p = (double*)onmalloc((g_count + 2*degree)*sizeof(*p));
    for ( j = 0, gi = g_count-order; j < degree; j++, gi++ ) {
      p[j] = g[0] - g[g_count-1] + g[gi];
    }
    for ( gi = 0, j = degree; gi < g_count; gi++, j++ ) {
      p[j] = g[gi];
    }
    for ( j = g_count+degree, gi = 1; j < g_count+2*degree; j++, gi++ ) {
      p[j] = g[g_count-1] - g[0] + g[gi];
    }

    // step 2: set new p[i] = old (p[i] + ... + p[i+degree-1]) / degree
    for ( j = 0; j < g_count+order; j++ ) {
      k = p[j];
      for ( ki = 1; ki < degree; ki++ ) 
        k += p[j+ki];
      k *= dd;
      if ( half_degree ) {
        // if g[]'s are uniform and degree is odd, then knots = g[]'s
        if ( fabs(k-p[j+half_degree]) <=  ON_SQRT_EPSILON*(p[j+degree-1]-p[j]) )
          k = p[j+half_degree];
      }
      p[j] = k;
    }

    // step 3: determine where g[0] maximizes NURBS basis functions
    {
      double* B = (double*)alloca(order*order*sizeof(B[0]));
      double maxB  = 0.0;
      int maxBj = 0;
      for ( j = 0; j < 2*degree; j++ ) {
        if ( g[0] > p[j+degree] )
          continue;
        if ( g[0] < p[j+degree-1] )
          break;
        ON_EvaluateNurbsBasis( order, p+j, g[0], B );
        if ( B[0] > maxB ) {
          maxB  = B[0];
          maxBj = j;
        }
      }
      memcpy( knot, &p[maxBj], knot_count*sizeof(*knot) );
    }

    rc = ON_MakeKnotVectorPeriodic( order, cv_count, knot );
  }
  else {
    // clamped knots
    rc = true;
    if ( g > knot && g < knot+knot_count ) {
      p = (double*)onmalloc(cv_count*sizeof(*p));
      for( j = 0; j < cv_count; j++ ) {
        p[j] = g[j*g_stride];
      }
      g = p;
      g_stride = 1;
    }
    for ( ki = 0; ki < degree; ki++ ) {
      knot[ki] = g[0];
    }
    for ( ki = degree, gi = 1; ki < cv_count; ki++, gi++ ) {
      k = 0.0;
      for ( j = 0; j < degree; j++ ) {
        k += g[(gi+j)*g_stride];
      }
      knot[ki] = k*dd;
      if ( knot[ki] < knot[ki-1] || knot[ki] <= knot[ki-degree] ) {
        rc = false;
      }
    }
    for ( ki = cv_count-1; ki < knot_count; ki++ ) {
      knot[ki] = g[(cv_count-1)*g_stride];
    }
  }

  if (p)
    onfree(p);
  return rc;
}